

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

llama_sampler *
llama_sampler_init_penalties
          (int32_t penalty_last_n,float penalty_repeat,float penalty_freq,float penalty_present)

{
  int *piVar1;
  llama_sampler_i *iface;
  llama_sampler *plVar2;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  ring_buffer<int> *unaff_retaddr;
  _func_void_llama_sampler_ptr **__s;
  int local_14;
  undefined4 local_10;
  undefined4 local_c;
  int iVar3;
  
  local_14 = 0;
  local_10 = in_XMM2_Da;
  local_c = in_XMM1_Da;
  piVar1 = std::max<int>((int *)&stack0xfffffffffffffffc,&local_14);
  iVar3 = *piVar1;
  iface = (llama_sampler_i *)operator_new(0x80);
  *(int *)&iface->name = iVar3;
  *(undefined4 *)((long)&iface->name + 4) = in_XMM0_Da;
  *(undefined4 *)&iface->accept = local_c;
  *(undefined4 *)((long)&iface->accept + 4) = local_10;
  ring_buffer<int>::ring_buffer(unaff_retaddr,CONCAT44(iVar3,in_XMM0_Da));
  __s = &iface[1].reset;
  memset(__s,0,0x38);
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)0x518155);
  plVar2 = llama_sampler_init(iface,__s);
  return plVar2;
}

Assistant:

struct llama_sampler * llama_sampler_init_penalties(
        int32_t penalty_last_n,
        float penalty_repeat,
        float penalty_freq,
        float penalty_present) {
    penalty_last_n = std::max(penalty_last_n, 0);

    return llama_sampler_init(
        /* .iface = */ &llama_sampler_penalties_i,
        /* .ctx   = */ new llama_sampler_penalties {
            /* .penalty_last_n  = */ penalty_last_n,
            /* .penalty_repeat  = */ penalty_repeat,
            /* .penalty_freq    = */ penalty_freq,
            /* .penalty_present = */ penalty_present,
            /* .prev            = */ ring_buffer<llama_token>(penalty_last_n),
            /* .token_count     = */ {},
        }
    );
}